

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O2

int dwarf_get_fde_for_die
              (Dwarf_Debug dbg,Dwarf_Die die,Dwarf_Fde_conflict *ret_fde,Dwarf_Error *error)

{
  Dwarf_Small *section_pointer;
  Dwarf_Unsigned DVar1;
  ulong section_length;
  Dwarf_Small *section_length_in;
  Dwarf_Signed DVar2;
  int iVar3;
  char *pcVar4;
  Dwarf_Signed DStackY_130;
  Dwarf_Half address_size;
  Dwarf_Fde_conflict local_f0;
  Dwarf_Small *local_e8;
  Dwarf_Attribute attr;
  Dwarf_Signed signdval;
  Dwarf_Cie_conflict new_cie;
  cie_fde_prefix_s prefix_c;
  cie_fde_prefix_s prefix;
  
  signdval = 0;
  local_f0 = (Dwarf_Fde_conflict)0x0;
  address_size = 0;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    pcVar4 = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_fde_for_die()either null or it containsa stale Dwarf_Debug pointer"
    ;
    DStackY_130 = 0x51;
LAB_001552a5:
    _dwarf_error_string((Dwarf_Debug)0x0,error,DStackY_130,pcVar4);
    return 1;
  }
  if (die == (Dwarf_Die)0x0) {
    pcVar4 = "DW_DLE_DIE_NUL: in dwarf_get_fde_for_die(): Called with Dwarf_Die argument null";
    DStackY_130 = 0x34;
    goto LAB_001552a5;
  }
  iVar3 = dwarf_attr(die,0x2001,&attr,error);
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = dwarf_formsdata(attr,&signdval,error);
  if (iVar3 != 0) {
    dwarf_dealloc_attribute(attr);
    return iVar3;
  }
  iVar3 = dwarf_get_die_address_size(die,&address_size,error);
  dwarf_dealloc_attribute(attr);
  if (iVar3 != 0) {
    return iVar3;
  }
  iVar3 = _dwarf_load_section(dbg,&dbg->de_debug_frame,error);
  DVar2 = signdval;
  if (iVar3 != 0) {
    return iVar3;
  }
  section_pointer = (dbg->de_debug_frame).dss_data;
  DVar1 = (dbg->de_debug_frame).dss_size;
  iVar3 = _dwarf_validate_register_numbers(dbg,error);
  if (iVar3 != 0) {
    return 1;
  }
  prefix_c.cf_section_ptr = (Dwarf_Small *)0x0;
  prefix_c.cf_section_index = 0;
  prefix_c.cf_cie_id = 0;
  prefix_c.cf_cie_id_addr = (Dwarf_Small *)0x0;
  prefix_c.cf_length = 0;
  prefix_c.cf_local_length_size = 0;
  prefix_c.cf_local_extension_size = 0;
  prefix_c.cf_section_length = 0;
  prefix_c.cf_start_addr = (Dwarf_Small *)0x0;
  prefix_c.cf_addr_after_prefix = (Dwarf_Small *)0x0;
  prefix.cf_start_addr = (Dwarf_Small *)0x0;
  prefix.cf_addr_after_prefix = (Dwarf_Small *)0x0;
  prefix.cf_length = 0;
  prefix.cf_local_length_size = 0;
  prefix.cf_local_extension_size = 0;
  prefix.cf_cie_id = 0;
  prefix.cf_cie_id_addr = (Dwarf_Small *)0x0;
  prefix.cf_section_length = 0;
  prefix.cf_section_ptr = (Dwarf_Small *)0x0;
  prefix.cf_section_index = 0;
  iVar3 = _dwarf_read_cie_fde_prefix
                    (dbg,section_pointer + DVar2,(dbg->de_debug_frame).dss_data,
                     (dbg->de_debug_frame).dss_index,(dbg->de_debug_frame).dss_size,&prefix,error);
  if (iVar3 == -1) {
    return -1;
  }
  if (iVar3 == 1) {
    return 1;
  }
  section_length = (dbg->de_debug_frame).dss_size;
  if (prefix.cf_cie_id < section_length) {
    local_e8 = (Dwarf_Small *)prefix.cf_cie_id;
    iVar3 = _dwarf_create_fde_from_after_start
                      (dbg,&prefix,section_pointer,section_length,prefix.cf_addr_after_prefix,
                       section_pointer + DVar1,0,(Dwarf_Cie_conflict)0x0,address_size,&local_f0,
                       error);
    if (iVar3 == -1) {
      return -1;
    }
    if (iVar3 == 1) {
      return 1;
    }
    local_f0->fd_fde_owns_cie = 1;
    section_length_in = (Dwarf_Small *)(dbg->de_debug_frame).dss_size;
    if (local_e8 < section_length_in) {
      if ((-1 < (long)local_e8) && (local_e8 <= local_f0->fd_section_ptr + (long)local_e8)) {
        iVar3 = _dwarf_read_cie_fde_prefix
                          (dbg,local_f0->fd_section_ptr + (long)local_e8,
                           (dbg->de_debug_frame).dss_data,(dbg->de_debug_frame).dss_index,
                           (Dwarf_Unsigned)section_length_in,&prefix_c,error);
        local_e8 = (Dwarf_Small *)CONCAT44(local_e8._4_4_,iVar3);
        if (iVar3 == -1) {
          dwarf_dealloc(dbg,local_f0,0x15);
          return -1;
        }
        if (iVar3 == 1) {
          dwarf_dealloc(dbg,local_f0,0x15);
          return 1;
        }
        if (prefix_c.cf_cie_id == 0xffffffffffffffff) {
          new_cie = (Dwarf_Cie_conflict)0x0;
          iVar3 = _dwarf_create_cie_from_after_start
                            (dbg,&prefix_c,section_pointer,prefix_c.cf_addr_after_prefix,
                             section_pointer + DVar1,0,0,&new_cie,error);
          if (iVar3 == 0) {
            local_f0->fd_cie = new_cie;
            *ret_fde = local_f0;
            return 0;
          }
          dwarf_dealloc(dbg,local_f0,0x15);
          return (int)local_e8;
        }
        dwarf_dealloc(dbg,local_f0,0x15);
        local_f0 = (Dwarf_Fde_conflict)0x0;
        pcVar4 = "DW_DLE_NO_CIE_FOR_FDE: The CIE id is not a true cid id. Corrupt DWARF.";
        goto LAB_001554e2;
      }
      dwarf_dealloc(dbg,local_f0,0x15);
      local_f0 = (Dwarf_Fde_conflict)0x0;
    }
  }
  pcVar4 = 
  "DW_DLE_NO_CIE_FOR_FDE: dwarf_get_fde_for_die fails as the CIE id offset is impossibly large";
LAB_001554e2:
  _dwarf_error_string(dbg,error,0x96,pcVar4);
  return 1;
}

Assistant:

int
dwarf_get_fde_for_die(Dwarf_Debug dbg,
    Dwarf_Die die,
    Dwarf_Fde * ret_fde, Dwarf_Error * error)
{
    Dwarf_Attribute attr;
    Dwarf_Unsigned fde_offset = 0;
    Dwarf_Signed signdval = 0;
    Dwarf_Fde new_fde = 0;
    unsigned char *fde_ptr = 0;
    unsigned char *fde_start_ptr = 0;
    unsigned char *fde_end_ptr = 0;
    unsigned char *cie_ptr = 0;
    Dwarf_Unsigned cie_id = 0;
    Dwarf_Half     address_size = 0;

    /* Fields for the current Cie being read. */
    int res = 0;
    int resattr = 0;
    int sdatares = 0;

    struct cie_fde_prefix_s prefix;
    struct cie_fde_prefix_s prefix_c;

    CHECK_DBG(dbg,error,"dwarf_get_fde_for_die()");
    if (!die ) {
        _dwarf_error_string(NULL, error, DW_DLE_DIE_NULL,
            "DW_DLE_DIE_NUL: in dwarf_get_fde_for_die(): "
            "Called with Dwarf_Die argument null");
        return DW_DLV_ERROR;
    }
    resattr = dwarf_attr(die, DW_AT_MIPS_fde, &attr, error);
    if (resattr != DW_DLV_OK) {
        return resattr;
    }
    /* why is this formsdata? FIX */
    sdatares = dwarf_formsdata(attr, &signdval, error);
    if (sdatares != DW_DLV_OK) {
        dwarf_dealloc_attribute(attr);
        return sdatares;
    }
    res = dwarf_get_die_address_size(die,&address_size,error);
    if (res != DW_DLV_OK) {
        dwarf_dealloc_attribute(attr);
        return res;
    }
    dwarf_dealloc_attribute(attr);
    res = _dwarf_load_section(dbg, &dbg->de_debug_frame,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    fde_offset = signdval;
    fde_start_ptr = dbg->de_debug_frame.dss_data;
    fde_ptr = fde_start_ptr + fde_offset;
    fde_end_ptr = fde_start_ptr + dbg->de_debug_frame.dss_size;
    res = _dwarf_validate_register_numbers(dbg,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }

    /*  First read in the 'common prefix' to figure out
        what we are to do with this entry. */
    memset(&prefix_c, 0, sizeof(prefix_c));
    memset(&prefix, 0, sizeof(prefix));
    res = _dwarf_read_cie_fde_prefix(dbg, fde_ptr,
        dbg->de_debug_frame.dss_data,
        dbg->de_debug_frame.dss_index,
        dbg->de_debug_frame.dss_size,
        &prefix,
        error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }
    fde_ptr = prefix.cf_addr_after_prefix;
    cie_id = prefix.cf_cie_id;
    if (cie_id  >=  dbg->de_debug_frame.dss_size ) {
        _dwarf_error_string(dbg, error, DW_DLE_NO_CIE_FOR_FDE,
            "DW_DLE_NO_CIE_FOR_FDE: "
            "dwarf_get_fde_for_die fails as the CIE id "
            "offset is impossibly large");
        return DW_DLV_ERROR;
    }
    /*  Pass NULL, not section pointer, for 3rd argument.
        de_debug_frame.dss_data has no eh_frame relevance. */
    res = _dwarf_create_fde_from_after_start(dbg, &prefix,
        fde_start_ptr,
        dbg->de_debug_frame.dss_size,
        fde_ptr,
        fde_end_ptr,
        /* use_gnu_cie_calc= */ 0,
        /* Dwarf_Cie = */ 0,
        address_size,
        &new_fde, error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }
    /* DW_DLV_OK */

    /*  This is the only situation this is set.
        and is really dangerous. as fde and cie
        are set for dealloc by dwarf_finish(). */
    new_fde->fd_fde_owns_cie = TRUE;
    /*  Now read the cie corresponding to the fde,
        _dwarf_read_cie_fde_prefix checks
        cie_ptr for being within the section. */
    if (cie_id  >=  dbg->de_debug_frame.dss_size ) {
        _dwarf_error_string(dbg, error, DW_DLE_NO_CIE_FOR_FDE,
            "DW_DLE_NO_CIE_FOR_FDE: "
            "dwarf_get_fde_for_die fails as the CIE id "
            "offset is impossibly large");
        return DW_DLV_ERROR;
    }
    cie_ptr = new_fde->fd_section_ptr + cie_id;
    if ((Dwarf_Unsigned)(uintptr_t)cie_ptr  <
        (Dwarf_Unsigned)(uintptr_t)new_fde->fd_section_ptr ||
        (Dwarf_Unsigned)(uintptr_t)cie_ptr <  cie_id) {
        dwarf_dealloc(dbg,new_fde,DW_DLA_FDE);
        new_fde = 0;
        _dwarf_error_string(dbg, error, DW_DLE_NO_CIE_FOR_FDE,
            "DW_DLE_NO_CIE_FOR_FDE: "
            "dwarf_get_fde_for_die fails as the CIE id "
            "offset is impossibly large");
        return DW_DLV_ERROR;
    }
    res = _dwarf_read_cie_fde_prefix(dbg, cie_ptr,
        dbg->de_debug_frame.dss_data,
        dbg->de_debug_frame.dss_index,
        dbg->de_debug_frame.dss_size,
        &prefix_c, error);
    if (res == DW_DLV_ERROR) {
        dwarf_dealloc(dbg,new_fde,DW_DLA_FDE);
        new_fde = 0;
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        dwarf_dealloc(dbg,new_fde,DW_DLA_FDE);
        new_fde = 0;
        return res;
    }

    cie_ptr = prefix_c.cf_addr_after_prefix;
    cie_id = prefix_c.cf_cie_id;

    if (cie_id == (Dwarf_Unsigned)DW_CIE_ID) {
        int res2 = 0;
        Dwarf_Cie new_cie = 0;

        /*  Pass NULL, not section pointer, for 3rd argument.
            de_debug_frame.dss_data has no eh_frame relevance. */
        res2 = _dwarf_create_cie_from_after_start(dbg,
            &prefix_c,
            fde_start_ptr,
            cie_ptr,
            fde_end_ptr,
            /* cie_count= */ 0,
            /* use_gnu_cie_calc= */
            0, &new_cie, error);
        if (res2 != DW_DLV_OK) {
            dwarf_dealloc(dbg, new_fde, DW_DLA_FDE);
            return res;
        }
        new_fde->fd_cie = new_cie;
    } else {
        dwarf_dealloc(dbg,new_fde,DW_DLA_FDE);
        new_fde = 0;
        _dwarf_error_string(dbg, error, DW_DLE_NO_CIE_FOR_FDE,
            "DW_DLE_NO_CIE_FOR_FDE: "
            "The CIE id is not a true cid id. Corrupt DWARF.");
        return DW_DLV_ERROR;
    }
    *ret_fde = new_fde;
    return DW_DLV_OK;
}